

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsPreviewDialog.cpp
# Opt level: O2

void __thiscall
KDReports::PreviewDialog::PreviewDialog(PreviewDialog *this,Report *report,QWidget *parent)

{
  unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
  *puVar1;
  PreviewDialogPrivate *pPVar2;
  PreviewWidget *pPVar3;
  QVBoxLayout *this_00;
  QHBoxLayout *this_01;
  undefined4 *puVar4;
  QDialogButtonBox *this_02;
  QPushButton *pQVar5;
  undefined8 in_stack_ffffffffffffff78;
  uint uVar8;
  ulong uVar6;
  int *piVar7;
  QArrayDataPointer<char16_t> local_68;
  Object local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  Connection local_38 [8];
  QObject local_30 [8];
  
  uVar8 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  QDialog::QDialog(&this->super_QDialog,parent,0);
  *(undefined ***)this = &PTR_metaObject_0016f938;
  *(undefined ***)&this->field_0x10 = &PTR__PreviewDialog_0016fb18;
  pPVar2 = (PreviewDialogPrivate *)operator_new(0x70);
  puVar1 = &this->d;
  pPVar2->q = this;
  pPVar2->m_previewWidget = (PreviewWidget *)0x0;
  pPVar2->m_buttonBox = (QDialogButtonBox *)0x0;
  pPVar2->m_quickPrintButton = (QPushButton *)0x0;
  (pPVar2->m_quickPrinterName).d.d = (Data *)0x0;
  *(char16_t **)((long)&(pPVar2->m_quickPrinterName).d + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(pPVar2->m_quickPrinterName).d + 0x10) = 0;
  (pPVar2->m_defaultSaveDirectory).d.d = (Data *)0x0;
  *(char16_t **)((long)&(pPVar2->m_defaultSaveDirectory).d + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(pPVar2->m_defaultSaveDirectory).d + 0x10) = 0;
  (pPVar2->m_savedFileName).d.d = (Data *)0x0;
  *(char16_t **)((long)&(pPVar2->m_savedFileName).d + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(pPVar2->m_savedFileName).d + 0x10) = 0;
  pPVar2->m_dirBrowsingEnabled = true;
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
  .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl = pPVar2;
  pPVar3 = (PreviewWidget *)operator_new(0x30);
  PreviewWidget::PreviewWidget(pPVar3,(QWidget *)this);
  ((puVar1->_M_t).
   super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
   ._M_t.
   super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
   .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)->m_previewWidget =
       pPVar3;
  PreviewWidget::setReport
            (((puVar1->_M_t).
              super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              ._M_t.
              super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)->
             m_previewWidget,report);
  this_00 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_00,(QWidget *)this);
  QBoxLayout::addWidget
            (this_00,((puVar1->_M_t).
                      super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
                      .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)
                     ->m_previewWidget,0,0);
  this_01 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_01);
  QBoxLayout::addLayout((QLayout *)this_00,(int)this_01);
  pPVar3 = ((puVar1->_M_t).
            super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
            ._M_t.
            super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
            .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)->
           m_previewWidget;
  local_68.d = (Data *)PreviewWidget::tableSettingsClicked;
  local_68.ptr = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x18);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsPreviewDialog.cpp:63:88),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(PreviewDialog **)(puVar4 + 4) = this;
  QObject::connectImpl
            (local_30,(void **)pPVar3,(QObject *)&local_68,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,(int *)((ulong)uVar8 << 0x20),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  local_68.d = (Data *)linkActivated;
  local_68.ptr = (char16_t *)0x0;
  uVar6 = 0;
  QObject::
  connect<void(KDReports::PreviewWidget::*)(QUrl_const&),void(KDReports::PreviewDialog::*)(QUrl_const&)>
            ((Object *)local_38,
             (offset_in_PreviewWidget_to_subr)
             ((this->d)._M_t.
              super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              ._M_t.
              super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)->
             m_previewWidget,(Object *)PreviewWidget::linkActivated,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection(local_38);
  this_02 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(this_02,Horizontal,(QWidget *)this);
  ((puVar1->_M_t).
   super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
   ._M_t.
   super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
   .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)->m_buttonBox =
       this_02;
  QBoxLayout::addWidget
            (this_01,((puVar1->_M_t).
                      super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
                      .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)
                     ->m_buttonBox,0,0);
  pQVar5 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_68,"&Print...",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar5,(QString *)&local_68,(QWidget *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QDialogButtonBox::addButton
            ((QAbstractButton *)
             ((puVar1->_M_t).
              super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              ._M_t.
              super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)->
             m_buttonBox,(ButtonRole)pQVar5);
  local_68.d = (Data *)QAbstractButton::clicked;
  local_68.ptr = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x18);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsPreviewDialog.cpp:71:65),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(PreviewDialog **)(puVar4 + 4) = this;
  piVar7 = (int *)(uVar6 & 0xffffffff00000000);
  QObject::connectImpl
            (local_40,(void **)pQVar5,(QObject *)&local_68,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,piVar7,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pQVar5 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar5,(QWidget *)this);
  ((puVar1->_M_t).
   super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
   ._M_t.
   super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
   .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)->
  m_quickPrintButton = pQVar5;
  pPVar2 = (puVar1->_M_t).
           super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl;
  QDialogButtonBox::addButton
            ((QAbstractButton *)pPVar2->m_buttonBox,(ButtonRole)pPVar2->m_quickPrintButton);
  pQVar5 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_68,"&Save...",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar5,(QString *)&local_68,(QWidget *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QDialogButtonBox::addButton
            ((QAbstractButton *)
             ((puVar1->_M_t).
              super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              ._M_t.
              super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)->
             m_buttonBox,(ButtonRole)pQVar5);
  local_68.d = (Data *)QAbstractButton::clicked;
  local_68.ptr = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x18);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsPreviewDialog.cpp:78:54),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(PreviewDialog **)(puVar4 + 4) = this;
  QObject::connectImpl
            (local_48,(void **)pQVar5,(QObject *)&local_68,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,(int *)((ulong)piVar7 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pQVar5 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_68,"Cancel",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar5,(QString *)&local_68,(QWidget *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QDialogButtonBox::addButton
            ((QAbstractButton *)
             ((puVar1->_M_t).
              super___uniq_ptr_impl<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              ._M_t.
              super__Tuple_impl<0UL,_KDReports::PreviewDialogPrivate_*,_std::default_delete<KDReports::PreviewDialogPrivate>_>
              .super__Head_base<0UL,_KDReports::PreviewDialogPrivate_*,_false>._M_head_impl)->
             m_buttonBox,(ButtonRole)pQVar5);
  local_68.d = (Data *)0x1c1;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QDialog::*)()>
            (local_50,(offset_in_QAbstractButton_to_subr)pQVar5,(Object *)QAbstractButton::clicked,0
             ,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QWidget::hide();
  return;
}

Assistant:

KDReports::PreviewDialog::PreviewDialog(KDReports::Report *report, QWidget *parent)
    : QDialog(parent)
    , d(new PreviewDialogPrivate(this))
{
    d->m_previewWidget = new KDReports::PreviewWidget(this);
    d->m_previewWidget->setReport(report);
    auto *topLayout = new QVBoxLayout(this);
    topLayout->addWidget(d->m_previewWidget);
    auto *bottomLayout = new QHBoxLayout();
    topLayout->addLayout(bottomLayout);

    connect(d->m_previewWidget, &KDReports::PreviewWidget::tableSettingsClicked, this, [this]() { d->slotTableBreakingDialog(); });
    connect(d->m_previewWidget, &KDReports::PreviewWidget::linkActivated, this, &KDReports::PreviewDialog::linkActivated);

    d->m_buttonBox = new QDialogButtonBox(Qt::Horizontal, this);
    bottomLayout->addWidget(d->m_buttonBox);

    auto *printWithDialogButton = new QPushButton(tr("&Print..."), this);
    d->m_buttonBox->addButton(printWithDialogButton, QDialogButtonBox::ActionRole);
    connect(printWithDialogButton, &QPushButton::clicked, this, [this]() { d->slotPrintWithDialog(); });

    d->m_quickPrintButton = new QPushButton(this); // create it here for the ordering
    d->m_buttonBox->addButton(d->m_quickPrintButton, QDialogButtonBox::ActionRole);

    auto *saveButton = new QPushButton(tr("&Save..."), this);
    d->m_buttonBox->addButton(saveButton, QDialogButtonBox::ActionRole);
    connect(saveButton, &QPushButton::clicked, this, [this]() { d->slotSave(); });

    auto *cancelButton = new QPushButton(tr("Cancel"), this);
    d->m_buttonBox->addButton(cancelButton, QDialogButtonBox::RejectRole);
    connect(cancelButton, &QPushButton::clicked, this, &QDialog::reject);

    d->m_quickPrintButton->hide();
}